

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O2

void ecx_pusherror(ecx_contextt *context,ec_errort *Ec)

{
  short sVar1;
  ec_eringt *peVar2;
  ec_timet eVar3;
  ec_timet eVar4;
  anon_union_8_2_f8b78f4e_for_ec_errort_6 aVar5;
  ec_errort *peVar6;
  uint8 uVar7;
  undefined1 uVar8;
  ec_err_type eVar9;
  short sVar10;
  short sVar11;
  
  peVar2 = context->elist;
  sVar11 = peVar2->head;
  eVar3 = Ec->Time;
  eVar4 = *(ec_timet *)&Ec->Signal;
  uVar7 = Ec->SubIdx;
  uVar8 = Ec->field_0xf;
  eVar9 = Ec->Etype;
  aVar5 = Ec->field_6;
  peVar6 = peVar2->Error + sVar11;
  peVar6->Index = Ec->Index;
  peVar6->SubIdx = uVar7;
  peVar6->field_0xf = uVar8;
  peVar6->Etype = eVar9;
  *(anon_union_8_2_f8b78f4e_for_ec_errort_6 *)(&peVar6->Index + 4) = aVar5;
  peVar2->Error[sVar11].Time = eVar3;
  (&peVar2->Error[sVar11].Time)[1] = eVar4;
  peVar2 = context->elist;
  sVar11 = peVar2->head;
  peVar2->Error[sVar11].Signal = '\x01';
  sVar11 = sVar11 + 1;
  if (0x40 < sVar11) {
    sVar11 = 0;
  }
  peVar2->head = sVar11;
  sVar1 = peVar2->tail;
  sVar10 = (ushort)(sVar11 == sVar1) + sVar1;
  if (sVar11 == sVar1 || 0x40 < sVar10) {
    if (0x40 < sVar10) {
      sVar10 = 0;
    }
    peVar2->tail = sVar10;
  }
  *context->ecaterror = '\x01';
  return;
}

Assistant:

void ecx_pusherror(ecx_contextt *context, const ec_errort *Ec)
{
   context->elist->Error[context->elist->head] = *Ec;
   context->elist->Error[context->elist->head].Signal = TRUE;
   context->elist->head++;
   if (context->elist->head > EC_MAXELIST)
   {
      context->elist->head = 0;
   }
   if (context->elist->head == context->elist->tail)
   {
      context->elist->tail++;
   }
   if (context->elist->tail > EC_MAXELIST)
   {
      context->elist->tail = 0;
   }
   *(context->ecaterror) = TRUE;
}